

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_shear(mat4 *__return_storage_ptr__,float theta,vec3 a,vec3 b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float t;
  float theta_local;
  undefined4 local_34;
  undefined4 uStack_30;
  vec3 b_local;
  undefined4 local_18;
  undefined4 uStack_14;
  vec3 a_local;
  
  fVar3 = b.z;
  fVar2 = a.z;
  fVar1 = tanf(theta);
  local_18 = a.x;
  local_34 = b.x;
  uStack_30 = b.y;
  uStack_14 = a.y;
  mat4_create(__return_storage_ptr__,local_18 * local_34 * fVar1 + 1.0,local_18 * uStack_30 * fVar1,
              local_18 * fVar3 * fVar1,0.0,uStack_14 * local_34 * fVar1,
              uStack_14 * uStack_30 * fVar1 + 1.0,uStack_14 * fVar3 * fVar1,0.0,
              fVar2 * local_34 * fVar1,fVar2 * uStack_30 * fVar1,fVar2 * fVar3 * fVar1 + 1.0,0.0,0.0
              ,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_shear(float theta, vec3 a, vec3 b) {
    float t = tanf(theta);
    return mat4_create(
            a.x * b.x * t + 1.0f, a.x * b.y * t, a.x * b.z * t, 0.0f,
            a.y * b.x * t, a.y * b.y * t + 1.0f, a.y * b.z * t, 0.0f,
            a.z * b.x * t, a.z * b.y * t, a.z * b.z * t + 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}